

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidSoftmax(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  Arena *pAVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  ArenaStringPtr *pAVar5;
  Tensor *this_01;
  ostream *poVar6;
  undefined1 local_d0 [8];
  Result res;
  NeuralNetworkLayer *layer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"input",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"probs",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_00,EXACT_ARRAY_MAPPING);
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  pAVar5 = &((NeuralNetworkLayer *)res.m_message.field_2._8_8_)->name_;
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation
                     ((MessageLite *)res.m_message.field_2._8_8_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar5,"softmax",pAVar3);
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::add_inputtensor
                      ((NeuralNetworkLayer *)res.m_message.field_2._8_8_);
  CoreML::Specification::Tensor::set_rank(this_01,2);
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_);
  CoreML::validate<(MLModelType)500>((Result *)local_d0,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_d0);
  if (m1._oneof_case_[0]._0_1_) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xcda);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_d0);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidSoftmax() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->set_name("softmax");
    layer->add_input("input");
    layer->add_output("probs");
    layer->add_inputtensor()->set_rank(2); // rank must be at least 3
    (void) layer->mutable_softmax();

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}